

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status filemgr_commit(filemgr *file,bool sync,err_log_callback *log_callback)

{
  fdb_status fVar1;
  filemgr *in_RDI;
  uint64_t bmp_revnum;
  err_log_callback *in_stack_000001a8;
  bool in_stack_000001b7;
  uint64_t in_stack_000001b8;
  bid_t in_stack_000001c0;
  filemgr *in_stack_000001c8;
  
  if (sb_ops.get_bmp_revnum != (_func_uint64_t_filemgr_ptr *)0x0) {
    (*sb_ops.get_bmp_revnum)(in_RDI);
  }
  fVar1 = filemgr_commit_bid(in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b7
                             ,in_stack_000001a8);
  return fVar1;
}

Assistant:

fdb_status filemgr_commit(struct filemgr *file, bool sync,
                          err_log_callback *log_callback)
{
    // append header at the end of the file
    uint64_t bmp_revnum = 0;
    if (sb_ops.get_bmp_revnum) {
        bmp_revnum = sb_ops.get_bmp_revnum(file);
    }
    return filemgr_commit_bid(file, BLK_NOT_FOUND, bmp_revnum,
                              sync, log_callback);
}